

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

void Assimp::IFC::ProcessExtrudedArea
               (IfcExtrudedAreaSolid *solid,TempMesh *curve,IfcVector3 *extrusionDir,
               TempMesh *result,ConversionData *conv,bool collect_openings)

{
  double dVar1;
  undefined1 auVar2 [16];
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar3;
  pointer pTVar4;
  element_type *peVar5;
  double *pdVar6;
  pointer paVar7;
  IfcVector3 extrusionDir_00;
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  bool bVar11;
  IfcProfileDef *pIVar12;
  ulong uVar13;
  IfcAxis2Placement3D *in_00;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __last;
  aiVector3t<double> *__x;
  ulong uVar14;
  long lVar15;
  TempMesh *pTVar16;
  IfcVector3 *v;
  pointer this;
  long lVar17;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __first;
  size_t i;
  pointer pTVar18;
  ulong uVar19;
  TempOpening *opening;
  long lVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> in;
  double local_268;
  IfcVector3 dir;
  undefined1 local_238 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_220;
  double local_218;
  shared_ptr<Assimp::IFC::TempMesh> profile2D;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> nors;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  undefined1 local_1c8 [32];
  TempOpening local_1a8;
  __shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2> local_138;
  double local_128;
  double dStack_120;
  double local_118;
  TempMesh temp;
  IfcVector3 profileNormal;
  IfcMatrix4 trafo;
  
  pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::operator->
                      ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)
                       &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &(pIVar12->
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                            field_0x10,"AREA");
  if (bVar10) {
    uVar13 = ((long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
    bVar10 = 2 < uVar13;
    if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
      if (uVar13 < 3) {
        return;
      }
      TempMesh::Append(result,curve);
      return;
    }
  }
  else {
    if (solid->Depth <= 1e-06 && solid->Depth != 1e-06) {
      return;
    }
    uVar13 = ((long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
    bVar10 = false;
  }
  local_220 = &result->mVertcnt;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,uVar13 << bVar10 + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_220,
             ((long)(curve->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 + 2);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector(&in,&curve->mVerts);
  trafo.a1 = 1.0;
  trafo.a2 = 0.0;
  trafo.a3 = 0.0;
  trafo.a4 = 0.0;
  trafo.b1 = 0.0;
  trafo.b2 = 1.0;
  trafo.b3 = 0.0;
  trafo.b4 = 0.0;
  trafo.c1 = 0.0;
  trafo.c2 = 0.0;
  trafo.c3 = 1.0;
  trafo.c4 = 0.0;
  trafo.d1 = 0.0;
  trafo.d2 = 0.0;
  trafo.d3 = 0.0;
  trafo.d4 = 1.0;
  in_00 = STEP::Lazy::operator_cast_to_IfcAxis2Placement3D_
                    ((Lazy *)&(solid->super_IfcSweptAreaSolid).Position);
  ConvertAxisPlacement(&trafo,in_00);
  paVar7 = in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1c8._8_8_ = 0x4202a05f20000000;
  local_1c8._0_8_ = 0x4202a05f20000000;
  local_238._8_8_ = 0xc202a05f20000000;
  local_238._0_8_ = 0xc202a05f20000000;
  local_218 = 10000000000.0;
  local_268 = -10000000000.0;
  for (this = in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start; this != paVar7; this = this + 1) {
    aiVector3t<double>::operator*=(this,&trafo);
    dVar1 = this->x;
    uVar21 = SUB84(dVar1,0);
    uVar22 = (undefined4)((ulong)dVar1 >> 0x20);
    dVar23 = dVar1;
    if (local_218 <= dVar1) {
      dVar23 = local_218;
    }
    if (dVar1 <= local_268) {
      uVar21 = SUB84(local_268,0);
      uVar22 = (undefined4)((ulong)local_268 >> 0x20);
    }
    auVar2._0_8_ = this->y;
    auVar2._8_8_ = this->z;
    local_1c8._0_16_ = minpd(auVar2,local_1c8._0_16_);
    local_238._0_16_ = maxpd(auVar2,local_238._0_16_);
    local_268 = (double)CONCAT44(uVar22,uVar21);
    local_218 = dVar23;
  }
  local_1a8.solid = (IfcSolidModel *)trafo.a1;
  local_1a8.extrusionDir.x = trafo.a2;
  local_1a8.extrusionDir.y = trafo.a3;
  local_1a8.extrusionDir.z = trafo.b1;
  local_1a8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)trafo.b2;
  local_1a8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trafo.b3;
  local_1a8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)trafo.c1;
  local_1a8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trafo.c2;
  local_1a8.wallPoints.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)trafo.c3;
  ::operator*((aiMatrix3x3t<double> *)&local_1a8,extrusionDir);
  TempMesh::ComputePolygonNormal
            (&profileNormal,
             in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
             .super__Vector_impl_data._M_start,
             ((long)in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,true);
  if (profileNormal.z * dir.z + profileNormal.x * dir.x + profileNormal.y * dir.y < 0.0) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
              (in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  nors.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nors.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nors.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar3 = conv->apply_openings;
  if (pvVar3 != (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0)
  {
    __first._M_current =
         (pvVar3->
         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>).
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (pvVar3->
         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__last._M_current != __first._M_current) {
      if (conv->settings->useCustomTriangulation == false) {
        std::
        __sort<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                  (__first,__last,
                   (_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>)
                   *in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
        __first._M_current =
             (conv->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (conv->apply_openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&nors,((long)__last._M_current - (long)__first._M_current) / 0x58);
      pTVar4 = (conv->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar18 = (conv->apply_openings->
                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                     )._M_impl.super__Vector_impl_data._M_start; pTVar18 != pTVar4;
          pTVar18 = pTVar18 + 1) {
        peVar5 = (pTVar18->profileMesh).
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pdVar6 = &((peVar5->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->x;
        if ((ulong)(((long)(peVar5->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar6) / 0x18) < 3) {
          local_1a8.solid = (IfcSolidModel *)0x0;
          local_1a8.extrusionDir.x = 0.0;
          local_1a8.extrusionDir.y = 0.0;
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          emplace_back<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&nors,
                     (aiVector3t<double> *)&local_1a8);
        }
        else {
          dVar1 = pdVar6[6] - *pdVar6;
          dVar24 = pdVar6[7] - pdVar6[1];
          dVar25 = pdVar6[8] - pdVar6[2];
          dVar23 = pdVar6[4] - pdVar6[1];
          dVar26 = pdVar6[5] - pdVar6[2];
          dVar27 = pdVar6[3] - *pdVar6;
          local_1a8.solid = (IfcSolidModel *)(dVar24 * dVar26 - dVar23 * dVar25);
          local_1a8.extrusionDir.x = dVar25 * dVar27 - dVar26 * dVar1;
          local_1a8.extrusionDir.y = dVar1 * dVar23 - dVar27 * dVar24;
          __x = aiVector3t<double>::Normalize((aiVector3t<double> *)&local_1a8);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    (&nors,__x);
        }
      }
      bVar9 = true;
      local_220 = &temp.mVertcnt;
      pTVar16 = &temp;
      goto LAB_004ec722;
    }
  }
  bVar9 = false;
  pTVar16 = result;
LAB_004ec722:
  local_218 = local_268 - local_218;
  temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar13 = 0;
  local_268 = 0.0;
  do {
    lVar17 = uVar13 * 0x18;
    do {
      lVar15 = lVar17;
      uVar14 = ((long)in.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      if (uVar14 <= uVar13) {
        if (bVar9) {
          pTVar4 = (conv->apply_openings->
                   super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pTVar18 = (conv->apply_openings->
                         super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                         )._M_impl.super__Vector_impl_data._M_start; pTVar18 != pTVar4;
              pTVar18 = pTVar18 + 1) {
            if ((pTVar18->wallPoints).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start !=
                (pTVar18->wallPoints).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish) {
              LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4ec972);
              paVar7 = (pTVar18->wallPoints).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((pTVar18->wallPoints).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish != paVar7) {
                (pTVar18->wallPoints).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = paVar7;
              }
            }
          }
        }
        if (!bVar10) {
          bVar10 = false;
LAB_004ecaf6:
          if ((bool)(bVar9 & (local_268 == 4.94065645841247e-324 | bVar10))) {
            LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4ecb17);
          }
          LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4ecb23);
          if ((collect_openings) &&
             (((result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start !=
               (result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish ||
              ((result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               (result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish)))) {
            if (conv->collect_openings ==
                (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0)
            {
              __assert_fail("conv.collect_openings",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                            ,0x29b,
                            "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                           );
            }
            pTVar16 = (TempMesh *)operator_new(0x30);
            (pTVar16->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pTVar16->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pTVar16->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pTVar16->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pTVar16->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pTVar16->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<Assimp::IFC::TempMesh,void>
                      ((__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2> *)&profile,
                       pTVar16);
            TempMesh::Swap(profile.
                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,result);
            pTVar16 = (TempMesh *)operator_new(0x30);
            (pTVar16->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pTVar16->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pTVar16->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pTVar16->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pTVar16->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pTVar16->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<Assimp::IFC::TempMesh,void>
                      ((__shared_ptr<Assimp::IFC::TempMesh,(__gnu_cxx::_Lock_policy)2> *)&profile2D,
                       pTVar16);
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                       profile2D.
                       super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       ((profile2D.
                         super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        )in.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        )in.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            local_1a8.solid =
                 (IfcSolidModel *)
                 CONCAT44(local_1a8.solid._4_4_,
                          (int)(((long)in.
                                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)in.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&(profile2D.
                         super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->mVertcnt,(uint *)&local_1a8);
            pvVar3 = conv->collect_openings;
            local_128 = dir.x;
            dStack_120 = dir.y;
            local_118 = dir.z;
            std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_138,
                       &profile.
                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>);
            std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_148,
                       &profile2D.
                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>);
            extrusionDir_00.y = dStack_120;
            extrusionDir_00.x = local_128;
            extrusionDir_00.z = local_118;
            TempOpening::TempOpening
                      (&local_1a8,(IfcSolidModel *)solid,extrusionDir_00,
                       (shared_ptr<Assimp::IFC::TempMesh> *)&local_138,
                       (shared_ptr<Assimp::IFC::TempMesh> *)&local_148);
            std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
            emplace_back<Assimp::IFC::TempOpening>(pvVar3,&local_1a8);
            TempOpening::~TempOpening(&local_1a8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount)
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount)
            ;
            if (((result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish) ||
               ((result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish)) {
              __assert_fail("result.IsEmpty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCGeometry.cpp"
                            ,0x2a4,
                            "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                           );
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&profile2D.
                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&profile.
                        super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          TempMesh::~TempMesh(&temp);
          std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                    (&nors.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
          std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                    (&in.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
          return;
        }
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_238._8_8_;
        local_238._0_16_ = auVar8 << 0x40;
        lVar17 = 0;
        do {
          if (lVar17 == 1) {
            lVar15 = 0x10;
            for (uVar13 = 0;
                uVar14 = ((long)in.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)in.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18, uVar13 < uVar14;
                uVar13 = uVar13 + 1) {
              local_1a8.extrusionDir.y =
                   *(double *)
                    ((long)&(in.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar15) + dir.z;
              pdVar6 = (double *)
                       ((long)in.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x10);
              local_1a8.solid = (IfcSolidModel *)(*pdVar6 + dir.x);
              local_1a8.extrusionDir.x = pdVar6[1] + dir.y;
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              emplace_back<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar16,
                         (aiVector3t<double> *)&local_1a8);
              lVar15 = lVar15 + 0x18;
            }
          }
          else {
            if (lVar17 == 2) {
              bVar10 = local_238._0_8_ == 2;
              goto LAB_004ecaf6;
            }
            lVar15 = ((long)in.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)in.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18;
            lVar20 = lVar15 + 1;
            lVar15 = lVar15 * 0x18;
            while( true ) {
              lVar20 = lVar20 + -1;
              if (lVar20 == 0) break;
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                        (&pTVar16->mVerts,
                         (value_type *)
                         ((long)&in.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].x + lVar15));
              lVar15 = lVar15 + -0x18;
            }
            uVar14 = ((long)in.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)in.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18;
          }
          local_1a8.solid = (IfcSolidModel *)CONCAT44(local_1a8.solid._4_4_,(int)uVar14);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (local_220,(uint *)&local_1a8);
          if ((bVar9) &&
             (2 < (ulong)(((long)in.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)in.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18))) {
            bVar10 = GenerateOpenings(conv->apply_openings,&nors,&temp,true,true,&dir);
            TempMesh::Append(result,&temp);
            TempMesh::Clear(&temp);
            local_238._0_8_ = local_238._0_8_ + (ulong)bVar10;
          }
          lVar17 = lVar17 + 1;
        } while( true );
      }
      uVar13 = uVar13 + 1;
      uVar19 = uVar13;
      if (uVar13 == uVar14) {
        uVar19 = 0;
      }
      local_1a8.solid = (IfcSolidModel *)CONCAT44(local_1a8.solid._4_4_,4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (local_220,(uint *)&local_1a8);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                (&pTVar16->mVerts,
                 (value_type *)
                 ((long)&(in.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar15));
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                (&pTVar16->mVerts,
                 in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar19);
      local_1a8.extrusionDir.y =
           in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar19].z + dir.z;
      local_1a8.solid =
           (IfcSolidModel *)
           (in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19].x + dir.x);
      local_1a8.extrusionDir.x =
           in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[uVar19].y + dir.y;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar16,
                 (aiVector3t<double> *)&local_1a8);
      local_1a8.extrusionDir.y =
           *(double *)
            ((long)&(in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->z + lVar15) + dir.z;
      pdVar6 = (double *)
               ((long)&(in.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->x + lVar15);
      local_1a8.solid = (IfcSolidModel *)(*pdVar6 + dir.x);
      local_1a8.extrusionDir.x = pdVar6[1] + dir.y;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)pTVar16,
                 (aiVector3t<double> *)&local_1a8);
      lVar17 = lVar15 + 0x18;
    } while (!bVar9);
    dVar1 = *(double *)
             ((long)&(in.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->x + lVar15) -
            in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19].x;
    dVar23 = *(double *)
              ((long)&(in.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y + lVar15) -
             in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
             .super__Vector_impl_data._M_start[uVar19].y;
    dVar24 = *(double *)
              ((long)&(in.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z + lVar15) -
             in.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
             .super__Vector_impl_data._M_start[uVar19].z;
    if (SQRT(((double)local_238._8_8_ - (double)local_1c8._8_8_) *
             ((double)local_238._8_8_ - (double)local_1c8._8_8_) +
             local_218 * local_218 +
             ((double)local_238._0_8_ - (double)local_1c8._0_8_) *
             ((double)local_238._0_8_ - (double)local_1c8._0_8_)) * 0.1 <
        SQRT(dVar24 * dVar24 + dVar1 * dVar1 + dVar23 * dVar23)) {
      bVar11 = GenerateOpenings(conv->apply_openings,&nors,&temp,true,true,&dir);
      local_268 = (double)((long)local_268 + (ulong)bVar11);
    }
    TempMesh::Append(result,&temp);
    TempMesh::Clear(&temp);
  } while( true );
}

Assistant:

void ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid& solid, const TempMesh& curve,
    const IfcVector3& extrusionDir, TempMesh& result, ConversionData &conv, bool collect_openings)
{
    // Outline: 'curve' is now a list of vertex points forming the underlying profile, extrude along the given axis,
    // forming new triangles.
    const bool has_area = solid.SweptArea->ProfileType == "AREA" && curve.mVerts.size() > 2;
    if( solid.Depth < 1e-6 ) {
        if( has_area ) {
            result.Append(curve);
        }
        return;
    }

    result.mVerts.reserve(curve.mVerts.size()*(has_area ? 4 : 2));
    result.mVertcnt.reserve(curve.mVerts.size() + 2);
    std::vector<IfcVector3> in = curve.mVerts;

    // First step: transform all vertices into the target coordinate space
    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);
    for(IfcVector3& v : in) {
        v *= trafo;

        vmin = std::min(vmin, v);
        vmax = std::max(vmax, v);
    }

    vmax -= vmin;
    const IfcFloat diag = vmax.Length();
    IfcVector3 dir = IfcMatrix3(trafo) * extrusionDir;

    // reverse profile polygon if it's winded in the wrong direction in relation to the extrusion direction
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(in.data(), in.size());
    if( profileNormal * dir < 0.0 )
        std::reverse(in.begin(), in.end());

    std::vector<IfcVector3> nors;
    const bool openings = !!conv.apply_openings && conv.apply_openings->size();

    // Compute the normal vectors for all opening polygons as a prerequisite
    // to TryAddOpenings_Poly2Tri()
    // XXX this belongs into the aforementioned function
    if( openings ) {

        if( !conv.settings.useCustomTriangulation ) {
            // it is essential to apply the openings in the correct spatial order. The direction
            // doesn't matter, but we would screw up if we started with e.g. a door in between
            // two windows.
            std::sort(conv.apply_openings->begin(), conv.apply_openings->end(), TempOpening::DistanceSorter(in[0]));
        }

        nors.reserve(conv.apply_openings->size());
        for(TempOpening& t : *conv.apply_openings) {
            TempMesh& bounds = *t.profileMesh.get();

            if( bounds.mVerts.size() <= 2 ) {
                nors.push_back(IfcVector3());
                continue;
            }
            nors.push_back(((bounds.mVerts[2] - bounds.mVerts[0]) ^ (bounds.mVerts[1] - bounds.mVerts[0])).Normalize());
        }
    }


    TempMesh temp;
    TempMesh& curmesh = openings ? temp : result;
    std::vector<IfcVector3>& out = curmesh.mVerts;

    size_t sides_with_openings = 0;
    for( size_t i = 0; i < in.size(); ++i ) {
        const size_t next = (i + 1) % in.size();

        curmesh.mVertcnt.push_back(4);

        out.push_back(in[i]);
        out.push_back(in[next]);
        out.push_back(in[next] + dir);
        out.push_back(in[i] + dir);

        if( openings ) {
            if( (in[i] - in[next]).Length() > diag * 0.1 && GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                ++sides_with_openings;
            }

            result.Append(temp);
            temp.Clear();
        }
    }

    if( openings ) {
        for(TempOpening& opening : *conv.apply_openings) {
            if( !opening.wallPoints.empty() ) {
                IFCImporter::LogError("failed to generate all window caps");
            }
            opening.wallPoints.clear();
        }
    }

    size_t sides_with_v_openings = 0;
    if( has_area ) {

        for( size_t n = 0; n < 2; ++n ) {
            if( n > 0 ) {
                for( size_t i = 0; i < in.size(); ++i )
                    out.push_back(in[i] + dir);
            }
            else {
                for( size_t i = in.size(); i--; )
                    out.push_back(in[i]);
            }

            curmesh.mVertcnt.push_back(static_cast<unsigned int>(in.size()));
            if( openings && in.size() > 2 ) {
                if( GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                    ++sides_with_v_openings;
                }

                result.Append(temp);
                temp.Clear();
            }
        }
    }

    if( openings && ((sides_with_openings == 1 && sides_with_openings) || (sides_with_v_openings == 2 && sides_with_v_openings)) ) {
        IFCImporter::LogWarn("failed to resolve all openings, presumably their topology is not supported by Assimp");
    }

    IFCImporter::LogDebug("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");

    // If this is an opening element, store both the extruded mesh and the 2D profile mesh
    // it was created from. Return an empty mesh to the caller.
    if( collect_openings && !result.IsEmpty() ) {
        ai_assert(conv.collect_openings);
        std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
        profile->Swap(result);

        std::shared_ptr<TempMesh> profile2D = std::shared_ptr<TempMesh>(new TempMesh());
        profile2D->mVerts.insert(profile2D->mVerts.end(), in.begin(), in.end());
        profile2D->mVertcnt.push_back(static_cast<unsigned int>(in.size()));
        conv.collect_openings->push_back(TempOpening(&solid, dir, profile, profile2D));

        ai_assert(result.IsEmpty());
    }
}